

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_partset_reg(TCGContext_conflict2 *tcg_ctx,int opsize,TCGv_i32 reg,TCGv_i32 val)

{
  TCGv_i32 ret;
  
  if (opsize - 2U < 2) {
    tcg_gen_mov_i32(tcg_ctx,reg,val);
    return;
  }
  if (opsize == 1) {
    tcg_gen_andi_i32_m68k(tcg_ctx,reg,reg,-0x10000);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ext16u_i32_m68k(tcg_ctx,ret,val);
  }
  else {
    tcg_gen_andi_i32_m68k(tcg_ctx,reg,reg,-0x100);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ext8u_i32_m68k(tcg_ctx,ret,val);
  }
  tcg_gen_or_i32(tcg_ctx,reg,reg,ret);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_partset_reg(TCGContext *tcg_ctx, int opsize, TCGv reg, TCGv val)
{
    TCGv tmp;
    switch (opsize) {
    case OS_BYTE:
        tcg_gen_andi_i32(tcg_ctx, reg, reg, 0xffffff00);
        tmp = tcg_temp_new(tcg_ctx);
        tcg_gen_ext8u_i32(tcg_ctx, tmp, val);
        tcg_gen_or_i32(tcg_ctx, reg, reg, tmp);
        tcg_temp_free(tcg_ctx, tmp);
        break;
    case OS_WORD:
        tcg_gen_andi_i32(tcg_ctx, reg, reg, 0xffff0000);
        tmp = tcg_temp_new(tcg_ctx);
        tcg_gen_ext16u_i32(tcg_ctx, tmp, val);
        tcg_gen_or_i32(tcg_ctx, reg, reg, tmp);
        tcg_temp_free(tcg_ctx, tmp);
        break;
    case OS_LONG:
    case OS_SINGLE:
        tcg_gen_mov_i32(tcg_ctx, reg, val);
        break;
    default:
        g_assert_not_reached();
    }
}